

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double chi_variance(double param_1,double b,double c)

{
  double dVar1;
  double dVar2;
  
  dVar1 = tgamma((c + 1.0) * 0.5);
  dVar2 = tgamma(c * 0.5);
  dVar1 = (dVar1 / dVar2) * (dVar1 / dVar2);
  return (c - (dVar1 + dVar1)) * b * b;
}

Assistant:

double chi_variance ( double /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_VARIANCE returns the variance of the Chi PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double VARIANCE, the variance of the PDF.
//
{
  double variance;

  variance = b * b * ( c - 2.0 *
    pow ( ( tgamma ( 0.5 * ( c + 1.0 ) ) / tgamma ( 0.5 * c ) ), 2 ) );

  return variance;
}